

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

int __thiscall QDate::daysInMonth(QDate *this,QCalendar cal)

{
  bool bVar1;
  long in_FS_OFFSET;
  YearMonthDay YVar2;
  YearMonthDay parts;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int month;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 *local_20;
  int local_18;
  QDate date;
  
  date.jd = *(qint64 *)(in_FS_OFFSET + 0x28);
  bVar1 = isValid((QDate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (bVar1) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = -0x55555556;
    YVar2 = QCalendar::partsFromDate
                      ((QCalendar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       date);
    iVar3 = YVar2.year;
    month = YVar2.month;
    iVar4 = YVar2.day;
    local_20 = YVar2._0_8_;
    local_18 = iVar4;
    bVar1 = QCalendar::YearMonthDay::isValid((YearMonthDay *)&local_20);
    if (bVar1) {
      iVar3 = QCalendar::daysInMonth
                        ((QCalendar *)CONCAT44(in_stack_ffffffffffffffd4,iVar4),month,iVar3);
      goto LAB_00565ff5;
    }
  }
  iVar3 = 0;
LAB_00565ff5:
  if (*(long *)(in_FS_OFFSET + 0x28) != date.jd) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QDate::daysInMonth(QCalendar cal) const
{
    if (isValid()) {
        const auto parts = cal.partsFromDate(*this);
        if (parts.isValid())
            return cal.daysInMonth(parts.month, parts.year);
    }
    return 0;
}